

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

void __thiscall Board::Board(Board *this,int size)

{
  pointer *ppCVar1;
  vector<Cell,_std::allocator<Cell>_> *this_00;
  iterator __position;
  ulong uVar2;
  int j;
  int iVar3;
  pointer local_68;
  pointer pCStack_60;
  pointer local_58;
  ulong local_50;
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  local_48;
  
  this->size = size;
  this->occupiedCells = 0;
  (this->table).
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table).
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table).
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pCStack_60 = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::~vector((vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
             *)&local_68);
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::~vector(&local_48);
  if (0 < size) {
    uVar2 = 0;
    local_50 = (ulong)(uint)size;
    do {
      local_68 = (pointer)0x0;
      pCStack_60 = (pointer)0x0;
      local_58 = (pointer)0x0;
      std::
      vector<std::vector<Cell,std::allocator<Cell>>,std::allocator<std::vector<Cell,std::allocator<Cell>>>>
      ::emplace_back<std::vector<Cell,std::allocator<Cell>>>
                ((vector<std::vector<Cell,std::allocator<Cell>>,std::allocator<std::vector<Cell,std::allocator<Cell>>>>
                  *)&this->table,(vector<Cell,_std::allocator<Cell>_> *)&local_68);
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68);
      }
      iVar3 = 0;
      do {
        this_00 = (this->table).
                  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar2;
        local_68 = (pointer)CONCAT44(iVar3,(int)uVar2);
        pCStack_60 = (pointer)((ulong)pCStack_60 & 0xffffffffffffff00);
        local_58 = (pointer)0x0;
        __position._M_current =
             (this_00->super__Vector_base<Cell,_std::allocator<Cell>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->super__Vector_base<Cell,_std::allocator<Cell>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Cell,_std::allocator<Cell>_>::_M_realloc_insert<Cell>
                    (this_00,__position,(Cell *)&local_68);
        }
        else {
          (__position._M_current)->playerOwned = (Player *)0x0;
          *(pointer *)__position._M_current = local_68;
          *(pointer *)&(__position._M_current)->occupied = pCStack_60;
          ppCVar1 = &(this_00->super__Vector_base<Cell,_std::allocator<Cell>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        iVar3 = iVar3 + 1;
      } while (size != iVar3);
      uVar2 = uVar2 + 1;
    } while (uVar2 != local_50);
  }
  return;
}

Assistant:

Board::Board(int size)
    :size(size), occupiedCells(0){

    table = vector< vector<Cell> >();

    for (int i=0; i<size; i++){
        table.push_back(vector<Cell>());
        for (int j=0; j<size; j++){
            table[i].push_back( Cell(i,j) );
        }
    }
}